

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagObjectModel.cpp
# Opt level: O1

BOOL __thiscall
Js::DiagScopeVariablesWalker::Get
          (DiagScopeVariablesWalker *this,int i,ResolvedObject *pResolvedObject)

{
  Type pIVar1;
  bool bVar2;
  code *pcVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  undefined4 *puVar7;
  Type *ppIVar8;
  List<Js::IDiagObjectModelWalkerBase_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *this_00;
  int iVar9;
  uint uVar10;
  int local_38;
  
  if ((-1 < i) && (i < (int)this->diagScopeVarCount)) {
    this_00 = this->pDiagScopeObjects;
    iVar9 = (this_00->
            super_ReadOnlyList<Js::IDiagObjectModelWalkerBase_*,_Memory::ArenaAllocator,_DefaultComparer>
            ).count;
    bVar2 = 0 < iVar9;
    if (0 < iVar9) {
      iVar9 = 0;
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      do {
        ppIVar8 = JsUtil::
                  List<Js::IDiagObjectModelWalkerBase_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                  ::Item(this_00,iVar9);
        pIVar1 = *ppIVar8;
        iVar5 = (*pIVar1->_vptr_IDiagObjectModelWalkerBase[1])(pIVar1);
        if (i < iVar5) {
          local_38 = (**pIVar1->_vptr_IDiagObjectModelWalkerBase)
                               (pIVar1,(ulong)(uint)i,pResolvedObject);
          uVar10 = i;
        }
        else {
          iVar6 = (*pIVar1->_vptr_IDiagObjectModelWalkerBase[1])(pIVar1);
          uVar10 = i - iVar6;
          if ((int)uVar10 < 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar7 = 1;
            bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                        ,0x405,"(i >=0)","i >=0");
            if (!bVar4) {
              pcVar3 = (code *)invalidInstructionException();
              (*pcVar3)();
            }
            *puVar7 = 0;
          }
        }
        if (i < iVar5) break;
        iVar9 = iVar9 + 1;
        this_00 = this->pDiagScopeObjects;
        iVar5 = (this_00->
                super_ReadOnlyList<Js::IDiagObjectModelWalkerBase_*,_Memory::ArenaAllocator,_DefaultComparer>
                ).count;
        bVar2 = iVar9 < iVar5;
        i = uVar10;
      } while (iVar9 < iVar5);
    }
    if (bVar2) {
      return local_38;
    }
  }
  return 0;
}

Assistant:

BOOL DiagScopeVariablesWalker::Get(int i, ResolvedObject* pResolvedObject)
    {
        if (i >= 0 && i < (int)diagScopeVarCount)
        {
            for (int j = 0; j < pDiagScopeObjects->Count(); j++)
            {
                IDiagObjectModelWalkerBase *pObjWalker = pDiagScopeObjects->Item(j);
                if (i < (int)pObjWalker->GetChildrenCount())
                {
                    return pObjWalker->Get(i, pResolvedObject);
                }
                i -= (int)pObjWalker->GetChildrenCount();
                Assert(i >=0);
            }
        }

        return FALSE;
    }